

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall
SimpleLoggerMgr::_flushStackTraceBuffer
          (SimpleLoggerMgr *this,size_t buffer_len,uint32_t tid_hash,uint64_t kernel_tid,
          bool crash_origin)

{
  byte bVar1;
  string *psVar2;
  ostream *this_00;
  long in_RCX;
  uint in_EDX;
  ulong in_RSI;
  long in_RDI;
  byte in_R8B;
  size_t ii;
  size_t per_log_size;
  size_t msg_len;
  char temp_buf [256];
  string msg;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  char *pcVar3;
  unsigned_long in_stack_fffffffffffffde8;
  string *local_1f8;
  string *msg_00;
  SimpleLoggerMgr *in_stack_fffffffffffffe20;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [48];
  char local_148 [256];
  string local_48 [39];
  byte local_21;
  long local_20;
  uint local_14;
  ulong local_10;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_48);
  snprintf(local_148,0x100,"\nThread %04x",(ulong)local_14);
  std::__cxx11::string::operator+=(local_48,local_148);
  if (local_20 != 0) {
    std::__cxx11::to_string(in_stack_fffffffffffffde8);
    std::operator+((char *)in_stack_fffffffffffffdb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    std::operator+(in_stack_fffffffffffffdb8,
                   (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    std::__cxx11::string::operator+=(local_48,local_178);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_1b8);
  }
  if ((local_21 & 1) != 0) {
    std::__cxx11::string::operator+=(local_48," (crashed here)");
  }
  std::__cxx11::string::operator+=(local_48,"\n\n");
  pcVar3 = *(char **)(in_RDI + 0x1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,pcVar3,local_10,(allocator *)&stack0xfffffffffffffe27);
  std::__cxx11::string::operator+=(local_48,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe27);
  psVar2 = (string *)std::__cxx11::string::size();
  msg_00 = (string *)0xc00;
  for (local_1f8 = (string *)0x0; local_1f8 < psVar2; local_1f8 = msg_00 + (long)local_1f8) {
    std::__cxx11::string::substr((ulong)&stack0xfffffffffffffde8,(ulong)local_48);
    flushAllLoggers(in_stack_fffffffffffffe20,(int)((ulong)psVar2 >> 0x20),msg_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
  }
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) != 0) {
    this_00 = std::operator<<((ostream *)(in_RDI + 0x228),local_48);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void SimpleLoggerMgr::_flushStackTraceBuffer(size_t buffer_len,
                                             uint32_t tid_hash,
                                             uint64_t kernel_tid,
                                             bool crash_origin)
{
    std::string msg;
    char temp_buf[256];
    snprintf(temp_buf, 256, "\nThread %04x", tid_hash);
    msg += temp_buf;
    if (kernel_tid) {
        msg += " (" + std::to_string(kernel_tid) + ")";
    }
    if (crash_origin) {
        msg += " (crashed here)";
    }
    msg += "\n\n";
    msg += std::string(stackTraceBuffer, buffer_len);

    size_t msg_len = msg.size();
    size_t per_log_size = SimpleLogger::MSG_SIZE - 1024;
    for (size_t ii=0; ii<msg_len; ii+=per_log_size) {
        flushAllLoggers(2, msg.substr(ii, per_log_size));
    }

    if (crashDumpFile.is_open()) {
        crashDumpFile << msg << std::endl;
    }
}